

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O1

btVector3 __thiscall btConvexHullInternal::getCoordinates(btConvexHullInternal *this,Vertex *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btScalar bVar3;
  btVector3 bVar4;
  btVector3 p;
  float local_20 [4];
  
  bVar3 = Vertex::xvalue(v);
  local_20[this->medAxis] = bVar3;
  bVar3 = Vertex::yvalue(v);
  local_20[this->maxAxis] = bVar3;
  bVar3 = Vertex::zvalue(v);
  local_20[this->minAxis] = bVar3;
  bVar4.m_floats[0] = local_20[0] * (this->scaling).m_floats[0] + (this->center).m_floats[0];
  uVar1 = *(undefined8 *)((this->scaling).m_floats + 1);
  uVar2 = *(undefined8 *)((this->center).m_floats + 1);
  bVar4.m_floats[1] = (float)uVar2 + (float)uVar1 * (float)local_20._4_8_;
  bVar4.m_floats[2] =
       (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20) * SUB84(local_20._4_8_,4);
  bVar4.m_floats[3] = 0.0;
  return (btVector3)bVar4.m_floats;
}

Assistant:

btVector3 btConvexHullInternal::getCoordinates(const Vertex* v)
{
	btVector3 p;
	p[medAxis] = v->xvalue();
	p[maxAxis] = v->yvalue();
	p[minAxis] = v->zvalue();
	return p * scaling + center;
}